

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O3

void sat_solver2_rollback(sat_solver2 *s)

{
  Vec_Set_t *pVVar1;
  uint *puVar2;
  veci *pvVar3;
  int **ppiVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  ulong uVar9;
  int *__ptr;
  byte bVar10;
  int *piVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  sat_solver2_rollback::Count = sat_solver2_rollback::Count + 1;
  if ((s->iVarPivot < 0) || (s->size < s->iVarPivot)) {
    __assert_fail("s->iVarPivot >= 0 && s->iVarPivot <= s->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x638,"void sat_solver2_rollback(sat_solver2 *)");
  }
  uVar12 = s->iTrailPivot;
  lVar17 = (long)(int)uVar12;
  if (lVar17 < 0) {
LAB_004f9f48:
    __assert_fail("s->iTrailPivot >= 0 && s->iTrailPivot <= s->qtail",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x639,"void sat_solver2_rollback(sat_solver2 *)");
  }
  uVar8 = s->qtail;
  uVar9 = (ulong)uVar8;
  if ((int)uVar8 < (int)uVar12) goto LAB_004f9f48;
  pVVar1 = s->pPrf1;
  if ((pVVar1 != (Vec_Set_t *)0x0) &&
     ((s->hProofPivot < 1 ||
      ((pVVar1->iPage << ((byte)pVVar1->nPageSize & 0x1f)) + (int)*pVVar1->pPages[pVVar1->iPage] <
       s->hProofPivot)))) {
    __assert_fail("s->pPrf1 == NULL || (s->hProofPivot >= 1 && s->hProofPivot <= Vec_SetHandCurrent(s->pPrf1))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x63a,"void sat_solver2_rollback(sat_solver2 *)");
  }
  if ((s->trail_lim).size != 0) {
    __assert_fail("solver2_dlevel(s) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x209,"void solver2_canceluntil_rollback(sat_solver2 *, int)");
  }
  if (uVar8 != s->qhead) {
    __assert_fail("s->qtail == s->qhead",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x20a,"void solver2_canceluntil_rollback(sat_solver2 *, int)");
  }
  if (uVar12 < uVar8) {
    do {
      lVar18 = uVar9 - 1;
      uVar9 = uVar9 - 1;
      iVar13 = s->trail[lVar18] >> 1;
      s->assigns[iVar13] = '\x03';
      s->reasons[iVar13] = 0;
      s->units[iVar13] = 0;
    } while (lVar17 < (long)uVar9);
    uVar8 = s->qhead;
  }
  if ((int)uVar12 < (int)uVar8) {
    lVar18 = (long)(int)uVar8;
    do {
      lVar14 = lVar18 + -1;
      lVar18 = lVar18 + -1;
      order_unassigned(s,s->trail[lVar14] >> 1);
    } while (lVar17 < lVar18);
  }
  s->qtail = uVar12;
  s->qhead = uVar12;
  iVar13 = s->iVarPivot;
  if (iVar13 < s->size) {
    if (s->activity2 != (uint *)0x0) {
      s->var_inc = s->var_inc2;
      memcpy(s->activity,s->activity2,(long)iVar13 << 2);
    }
    if ((s->order).size < 0) goto LAB_004f9eeb;
    (s->order).size = 0;
    iVar13 = s->iVarPivot;
    if (0 < iVar13) {
      lVar17 = 0;
      do {
        if (s->assigns[lVar17] == '\x03') {
          uVar12 = (s->order).size;
          piVar11 = s->orderpos;
          piVar11[lVar17] = uVar12;
          __ptr = (s->order).ptr;
          if (uVar12 == (s->order).cap) {
            iVar13 = (uVar12 >> 1) * 3;
            if ((int)uVar12 < 4) {
              iVar13 = uVar12 * 2;
            }
            if (__ptr == (int *)0x0) {
              __ptr = (int *)malloc((long)iVar13 << 2);
            }
            else {
              __ptr = (int *)realloc(__ptr,(long)iVar13 << 2);
            }
            (s->order).ptr = __ptr;
            if (__ptr == (int *)0x0) {
              printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                     (double)(s->order).cap * 9.5367431640625e-07,
                     (double)iVar13 * 9.5367431640625e-07);
              fflush(_stdout);
            }
            (s->order).cap = iVar13;
            uVar12 = (s->order).size;
            piVar11 = s->orderpos;
          }
          (s->order).size = uVar12 + 1;
          __ptr[(int)uVar12] = (int)lVar17;
          uVar9 = (ulong)piVar11[lVar17];
          iVar13 = __ptr[uVar9];
          if (uVar9 == 0) {
            uVar12 = 0;
          }
          else {
            if (piVar11[lVar17] == -1) {
              __assert_fail("s->orderpos[v] != -1",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                            ,0xf2,"void order_update(sat_solver2 *, int)");
            }
            puVar2 = s->activity;
            do {
              uVar8 = (uint)uVar9;
              uVar16 = (int)((uVar8 - ((int)(uVar8 - 1) >> 0x1f)) + -1) >> 1;
              iVar15 = __ptr[(int)uVar16];
              uVar12 = uVar8;
              if (puVar2[iVar13] <= puVar2[iVar15]) break;
              __ptr[(int)uVar8] = iVar15;
              piVar11[iVar15] = uVar8;
              uVar9 = (ulong)uVar16;
              uVar12 = uVar16;
            } while (2 < uVar8);
          }
          __ptr[(int)uVar12] = iVar13;
          piVar11[iVar13] = uVar12;
          iVar13 = s->iVarPivot;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < iVar13);
      goto LAB_004f9bcd;
    }
LAB_004f9c4d:
    uVar9 = (ulong)(uint)(iVar13 * 2);
  }
  else {
LAB_004f9bcd:
    if (iVar13 < 1) goto LAB_004f9c4d;
    pvVar3 = s->wlists;
    lVar17 = 0;
    do {
      iVar13 = pvVar3[lVar17].size;
      if (iVar13 < 1) {
        iVar15 = 0;
      }
      else {
        piVar11 = pvVar3[lVar17].ptr;
        lVar18 = 0;
        iVar15 = 0;
        do {
          uVar12 = piVar11[lVar18];
          if ((int)uVar12 < (s->Mem).BookMarkH[((s->Mem).uLearnedMask & uVar12) != 0]) {
            lVar14 = (long)iVar15;
            iVar15 = iVar15 + 1;
            piVar11[lVar14] = uVar12;
            iVar13 = pvVar3[lVar17].size;
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < iVar13);
      }
      if (iVar13 < iVar15) goto LAB_004f9eeb;
      pvVar3[lVar17].size = iVar15;
      lVar17 = lVar17 + 1;
      uVar9 = (long)s->iVarPivot * 2;
    } while (SBORROW8(lVar17,uVar9) != lVar17 + (long)s->iVarPivot * -2 < 0);
  }
  auVar7 = _DAT_008403e0;
  auVar6 = _DAT_008403d0;
  auVar5 = _DAT_008403c0;
  lVar17 = (long)s->size * 2;
  iVar13 = (int)uVar9;
  if (iVar13 < (int)lVar17) {
    lVar17 = lVar17 - iVar13;
    lVar18 = lVar17 + -1;
    auVar19._8_4_ = (int)lVar18;
    auVar19._0_8_ = lVar18;
    auVar19._12_4_ = (int)((ulong)lVar18 >> 0x20);
    piVar11 = &s->wlists[(long)iVar13 + 3].size;
    uVar9 = 0;
    auVar19 = auVar19 ^ _DAT_008403e0;
    do {
      auVar20._8_4_ = (int)uVar9;
      auVar20._0_8_ = uVar9;
      auVar20._12_4_ = (int)(uVar9 >> 0x20);
      auVar21 = (auVar20 | auVar6) ^ auVar7;
      iVar13 = auVar19._4_4_;
      if ((bool)(~(auVar21._4_4_ == iVar13 && auVar19._0_4_ < auVar21._0_4_ ||
                  iVar13 < auVar21._4_4_) & 1)) {
        piVar11[-0xc] = 0;
      }
      if ((auVar21._12_4_ != auVar19._12_4_ || auVar21._8_4_ <= auVar19._8_4_) &&
          auVar21._12_4_ <= auVar19._12_4_) {
        piVar11[-8] = 0;
      }
      auVar20 = (auVar20 | auVar5) ^ auVar7;
      iVar15 = auVar20._4_4_;
      if (iVar15 <= iVar13 && (iVar15 != iVar13 || auVar20._0_4_ <= auVar19._0_4_)) {
        piVar11[-4] = 0;
        *piVar11 = 0;
      }
      uVar9 = uVar9 + 4;
      piVar11 = piVar11 + 0x10;
    } while ((lVar17 + 3U & 0xfffffffffffffffc) != uVar9);
  }
  uVar12 = (s->Mem).BookMarkE[0];
  (s->stats).clauses = uVar12;
  uVar8 = (s->Mem).BookMarkE[1];
  (s->stats).learnts = uVar8;
  (s->Mem).nEntries[0] = uVar12;
  (s->Mem).nEntries[1] = uVar8;
  bVar10 = (byte)(s->Mem).nPageSize;
  uVar12 = (s->Mem).BookMarkH[0];
  iVar13 = (s->Mem).BookMarkH[1];
  iVar15 = (int)uVar12 >> (bVar10 & 0x1f);
  (s->Mem).iPage[0] = iVar15;
  (s->Mem).iPage[1] = iVar13 >> (bVar10 & 0x1f);
  ppiVar4 = (s->Mem).pPages;
  *ppiVar4[iVar15] = uVar12 & (s->Mem).uPageMask;
  *ppiVar4[(s->Mem).iPage[1]] = (s->Mem).uPageMask & (s->Mem).BookMarkH[1];
  uVar12 = (s->stats).learnts;
  if ((int)uVar12 <= (s->act_clas).size) {
    (s->act_clas).size = uVar12;
    pVVar1 = s->pPrf1;
    if (pVVar1 != (Vec_Set_t *)0x0) {
      if ((s->claProofs).size < (int)uVar12) goto LAB_004f9eeb;
      (s->claProofs).size = uVar12;
      bVar10 = (byte)pVVar1->nPageSize;
      uVar12 = s->hProofPivot;
      if ((pVVar1->iPage << (bVar10 & 0x1f)) + (int)*pVVar1->pPages[pVVar1->iPage] < (int)uVar12) {
        __assert_fail("h <= Vec_SetHandCurrent(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecSet.h"
                      ,0x111,"void Vec_SetShrink(Vec_Set_t *, int)");
      }
      iVar13 = (int)uVar12 >> (bVar10 & 0x1f);
      pVVar1->iPage = iVar13;
      *pVVar1->pPages[iVar13] = (long)(int)(pVVar1->uPageMask & uVar12);
    }
    if (s->pPrf2 == (Prf_Man_t *)0x0) {
      s->size = s->iVarPivot;
      if (s->iVarPivot == 0) {
        s->qhead = 0;
        s->qtail = 0;
        s->cla_inc = 0x800;
        s->root_level = 0;
        s->random_seed = 91648253.0;
        s->progress_estimate = 0.0;
        s->verbosity = 0;
        s->var_inc = 0x20;
        (s->stats).starts = 0;
        (s->stats).clauses = 0;
        (s->stats).learnts = 0;
        (s->stats).decisions = 0;
        (s->stats).propagations = 0;
        (s->stats).inspects = 0;
        (s->stats).conflicts = 0;
        (s->stats).clauses_literals = 0;
        (s->stats).learnts_literals = 0;
        (s->stats).tot_literals = 0;
        s->hLearntLast = -1;
        s->hProofLast = -1;
        s->iTrailPivot = 0;
        s->hProofPivot = 1;
      }
      return;
    }
    __assert_fail("s->pPrf2 == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x66c,"void sat_solver2_rollback(sat_solver2 *)");
  }
LAB_004f9eeb:
  __assert_fail("k <= v->size",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satVec.h"
                ,0x30,"void veci_resize(veci *, int)");
}

Assistant:

void sat_solver2_rollback( sat_solver2* s )
{
    Sat_Mem_t * pMem = &s->Mem;
    int i, k, j;
    static int Count = 0;
    Count++;
    assert( s->iVarPivot >= 0 && s->iVarPivot <= s->size );
    assert( s->iTrailPivot >= 0 && s->iTrailPivot <= s->qtail );
    assert( s->pPrf1 == NULL || (s->hProofPivot >= 1 && s->hProofPivot <= Vec_SetHandCurrent(s->pPrf1)) );
    // reset implication queue
    solver2_canceluntil_rollback( s, s->iTrailPivot );
    // update order 
    if ( s->iVarPivot < s->size )
    { 
        if ( s->activity2 )
        {
            s->var_inc = s->var_inc2;
            memcpy( s->activity, s->activity2, sizeof(unsigned) * s->iVarPivot );
        }
        veci_resize(&s->order, 0);
        for ( i = 0; i < s->iVarPivot; i++ )
        {
            if ( var_value(s, i) != varX )
                continue;
            s->orderpos[i] = veci_size(&s->order);
            veci_push(&s->order,i);
            order_update(s, i);
        }
    }
    // compact watches
    for ( i = 0; i < s->iVarPivot*2; i++ )
    {
        cla* pArray = veci_begin(&s->wlists[i]);
        for ( j = k = 0; k < veci_size(&s->wlists[i]); k++ )
            if ( Sat_MemClauseUsed(pMem, pArray[k]) )
                pArray[j++] = pArray[k];
        veci_resize(&s->wlists[i],j);
    }
    // reset watcher lists
    for ( i = 2*s->iVarPivot; i < 2*s->size; i++ )
        s->wlists[i].size = 0;

    // reset clause counts
    s->stats.clauses = pMem->BookMarkE[0];
    s->stats.learnts = pMem->BookMarkE[1];
    // rollback clauses
    Sat_MemRollBack( pMem );

    // resize learned arrays
    veci_resize(&s->act_clas,  s->stats.learnts);
    if ( s->pPrf1 ) 
    {
        veci_resize(&s->claProofs, s->stats.learnts);
        Vec_SetShrink(s->pPrf1, s->hProofPivot); 
        // some weird bug here, which shows only on 64-bits!
        // temporarily, perform more general proof reduction
//        Sat_ProofReduce( s->pPrf1, &s->claProofs, s->hProofPivot );
    }
    assert( s->pPrf2 == NULL );
//    if ( s->pPrf2 )
//        Prf_ManShrink( s->pPrf2, s->stats.learnts );

    // initialize other vars
    s->size = s->iVarPivot;
    if ( s->size == 0 )
    {
    //    s->size                   = 0;
    //    s->cap                    = 0;
        s->qhead                  = 0;
        s->qtail                  = 0;
#ifdef USE_FLOAT_ACTIVITY2
        s->var_inc                = 1;
        s->cla_inc                = 1;
        s->var_decay              = (float)(1 / 0.95  );
        s->cla_decay              = (float)(1 / 0.999 );
#else
        s->var_inc                = (1 <<  5);
        s->cla_inc                = (1 << 11);
#endif
        s->root_level             = 0;
        s->random_seed            = 91648253;
        s->progress_estimate      = 0;
        s->verbosity              = 0;

        s->stats.starts           = 0;
        s->stats.decisions        = 0;
        s->stats.propagations     = 0;
        s->stats.inspects         = 0;
        s->stats.conflicts        = 0;
        s->stats.clauses          = 0;
        s->stats.clauses_literals = 0;
        s->stats.learnts          = 0;
        s->stats.learnts_literals = 0;
        s->stats.tot_literals     = 0;
        // initialize clause pointers
        s->hLearntLast            = -1; // the last learnt clause 
        s->hProofLast             = -1; // the last proof ID

        // initialize rollback
        s->iVarPivot              =  0; // the pivot for variables
        s->iTrailPivot            =  0; // the pivot for trail
        s->hProofPivot            =  1; // the pivot for proof records
    }
}